

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O3

void WriteFramePPM(GB *gb,char *filename)

{
  uint uVar1;
  char cVar2;
  ostream *poVar3;
  long *plVar5;
  runtime_error *prVar6;
  long *plVar7;
  u8 *puVar8;
  long lVar9;
  ofstream file;
  long *local_298;
  long local_290;
  long local_288;
  long lStack_280;
  undefined8 local_278;
  undefined1 *local_270 [2];
  undefined1 local_260 [16];
  long *local_250;
  long local_248;
  long local_240;
  long lStack_238;
  long local_230;
  filebuf local_228 [8];
  undefined8 auStack_220 [2];
  byte abStack_210 [216];
  ios_base local_138 [264];
  undefined8 uVar4;
  
  std::ofstream::ofstream(&local_230,filename,_S_out);
  if ((abStack_210[*(long *)(local_230 + -0x18)] & 5) != 0) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_270[0] = local_260;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"Failed to open file \"","")
    ;
    plVar5 = (long *)std::__cxx11::string::append((char *)local_270);
    local_250 = (long *)*plVar5;
    plVar7 = plVar5 + 2;
    if (local_250 == plVar7) {
      local_240 = *plVar7;
      lStack_238 = plVar5[3];
      local_250 = &local_240;
    }
    else {
      local_240 = *plVar7;
    }
    local_248 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_250);
    local_298 = (long *)*plVar5;
    plVar7 = plVar5 + 2;
    if (local_298 == plVar7) {
      local_288 = *plVar7;
      lStack_280 = plVar5[3];
      local_298 = &local_288;
    }
    else {
      local_288 = *plVar7;
    }
    local_290 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::runtime_error::runtime_error(prVar6,(string *)&local_298);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"P3\n160 144\n255\n",0xf)
  ;
  puVar8 = (gb->s).ppu_buffer;
  uVar4 = 0;
  do {
    lVar9 = 0;
    local_278 = uVar4;
    do {
      uVar1 = *(uint *)(&DAT_0010e240 + (ulong)puVar8[lVar9] * 4);
      *(undefined8 *)((long)auStack_220 + *(long *)(local_230 + -0x18)) = 3;
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&local_230,uVar1 & 0xff);
      local_298._0_1_ = (string)0x20;
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_298,1);
      *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 3;
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar1 >> 8 & 0xff);
      local_298._0_1_ = (string)0x20;
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_298,1);
      *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 3;
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar1 >> 0x10 & 0xff);
      local_298 = (long *)CONCAT71(local_298._1_7_,0x20);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_298,1);
      lVar9 = lVar9 + 1;
    } while ((char)lVar9 != -0x60);
    local_298 = (long *)CONCAT71(local_298._1_7_,10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,(char *)&local_298,1);
    puVar8 = puVar8 + lVar9;
    cVar2 = (char)local_278 + '\x01';
    uVar4 = CONCAT71((int7)((ulong)local_278 >> 8),cVar2);
  } while (cVar2 != -0x70);
  if ((abStack_210[*(long *)(local_230 + -0x18)] & 1) == 0) {
    local_230 = _VTT;
    *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
    std::filebuf::~filebuf(local_228);
    std::ios_base::~ios_base(local_138);
    return;
  }
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar6,"Failed to write file.");
  __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void WriteFramePPM(const GB& gb, const char* filename) {
  std::ofstream file(filename, std::ios::out);
  if (!file) {
    throw Error(std::string("Failed to open file \"") + filename + "\".");
  }
  u32 colors[] = {0xffffffffu, 0xffaaaaaau, 0xff555555u, 0xff000000u};
  file << "P3\n160 144\n255\n";
  u8 x, y;
  const u8* data = gb.s.ppu_buffer;
  for (y = 0; y < 144; ++y) {
    for (x = 0; x < 160; ++x) {
      u32 pixel = colors[*data++];
      int b = (pixel >> 16) & 0xff;
      int g = (pixel >> 8) & 0xff;
      int r = (pixel >> 0) & 0xff;
      file << std::setw(3) << r << ' ' << std::setw(3) << g << ' '
           << std::setw(3) << b << ' ';
    }
    file << '\n';
  }
  if (file.bad()) {
    throw Error("Failed to write file.");
  }
}